

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

CURLcode tool2curlmime(CURL *curl,tool_mime *m,curl_mime **mime)

{
  CURLcode CVar1;
  curl_mime *mime_00;
  
  mime_00 = (curl_mime *)curl_mime_init();
  *mime = mime_00;
  if (mime_00 == (curl_mime *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CVar1 = tool2curlparts(curl,m->subparts,mime_00);
  }
  if (CVar1 != CURLE_OK) {
    curl_mime_free(*mime);
    *mime = (curl_mime *)0x0;
  }
  return CVar1;
}

Assistant:

CURLcode tool2curlmime(CURL *curl, tool_mime *m, curl_mime **mime)
{
  CURLcode ret = CURLE_OK;

  *mime = curl_mime_init(curl);
  if(!*mime)
    ret = CURLE_OUT_OF_MEMORY;
  else
    ret = tool2curlparts(curl, m->subparts, *mime);
  if(ret) {
    curl_mime_free(*mime);
    *mime = NULL;
  }
  return ret;
}